

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

void __thiscall
Clasp::WeightConstraint::WeightConstraint
          (WeightConstraint *this,Solver *s,SharedContext *ctx,Literal W,WeightLitsRep *rep,WL *out,
          uint32 act)

{
  _func_int **pp_Var1;
  bool bVar2;
  bool bVar3;
  ValueRep VVar4;
  Literal LVar5;
  uint uVar6;
  uint32 uVar7;
  Var VVar8;
  uint uVar9;
  Literal LVar10;
  WeightConstraint *this_00;
  uint32 in_ECX;
  uint32 uVar11;
  long in_RDX;
  Solver *in_RSI;
  Constraint *in_RDI;
  WeightLitsRep *in_R8;
  WL *in_R9;
  uint in_stack_00000008;
  uint32 d;
  uint32 off;
  uint32 j;
  uint32 sz;
  WeightLiteral *x;
  weight_t w;
  Literal *h;
  Literal *p;
  bool hasW;
  undefined2 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefa;
  uint32 in_stack_fffffffffffffefc;
  WeightConstraint *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  Var in_stack_ffffffffffffff0c;
  Solver *in_stack_ffffffffffffff10;
  Solver *this_01;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  WeightConstraint *in_stack_ffffffffffffff20;
  bool local_c3;
  Literal in_stack_ffffffffffffff84;
  int iVar12;
  WeightLiteral *pWVar13;
  Literal *local_58;
  _func_int **local_50;
  Literal local_4;
  
  local_4.rep_ = in_ECX;
  Constraint::Constraint(in_RDI);
  in_RDI->_vptr_Constraint = (_func_int **)&PTR_propagate_002df150;
  bVar2 = WeightLitsRep::hasWeights(in_R8);
  in_RDI[1]._vptr_Constraint = (_func_int **)in_R9;
  *(uint *)&in_RDI[2]._vptr_Constraint =
       *(uint *)&in_RDI[2]._vptr_Constraint & 0xcfffffff | (in_stack_00000008 & 3) << 0x1c;
  bVar3 = WL::shareable(in_R9);
  *(uint *)&in_RDI[2]._vptr_Constraint =
       *(uint *)&in_RDI[2]._vptr_Constraint & 0xf7ffffff | ((byte)~bVar3 & 1) << 0x1b;
  pp_Var1 = in_RDI[1]._vptr_Constraint;
  *(uint32 *)((long)&in_RDI[3]._vptr_Constraint + 4) = local_4.rep_;
  *(weight_t *)((long)&in_RDI[2]._vptr_Constraint + 4) = (in_R8->reach - in_R8->bound) + 1;
  *(weight_t *)&in_RDI[3]._vptr_Constraint = in_R8->bound;
  LVar5 = Literal::operator~((Literal *)
                             CONCAT44(in_stack_fffffffffffffefc,
                                      CONCAT22(in_stack_fffffffffffffefa,in_stack_fffffffffffffef8))
                            );
  *(uint32 *)((long)pp_Var1 + 4) = LVar5.rep_;
  local_50 = pp_Var1 + 1;
  if (bVar2) {
    LVar5 = Literal::fromRep(0x216b2b);
    local_50 = (_func_int **)((long)pp_Var1 + 0xc);
    *(uint32 *)(pp_Var1 + 1) = LVar5.rep_;
  }
  if (in_RDX != 0) {
    Literal::var(&local_4);
    SharedContext::setFrozen
              ((SharedContext *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               SUB41((uint)in_stack_ffffffffffffff08 >> 0x18,0));
  }
  Literal::var(&local_4);
  VVar4 = Solver::topValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (VVar4 != '\0') {
    bVar3 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                            (Literal)(uint32)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    *(uint *)&in_RDI[2]._vptr_Constraint =
         *(uint *)&in_RDI[2]._vptr_Constraint & 0xcfffffff | (uint)bVar3 << 0x1c;
  }
  local_c3 = (*(uint *)&in_RDI[2]._vptr_Constraint >> 0x1c & 3) != 3 || in_RDX == 0;
  *(uint *)&in_RDI[2]._vptr_Constraint =
       *(uint *)&in_RDI[2]._vptr_Constraint & 0x3fffffff | (3 - (uint)local_c3) * 0x40000000;
  pWVar13 = in_R8->lits;
  uVar7 = in_R8->size;
  iVar12 = 1;
  local_58 = (Literal *)((long)&in_RDI[3]._vptr_Constraint + 4);
  while (uVar11 = uVar7 - 1, uVar7 != 0) {
    local_58[1].rep_ = (pWVar13->first).rep_;
    *(uint32 *)local_50 = (pWVar13->first).rep_;
    uVar7 = uVar11;
    pp_Var1 = (_func_int **)((long)local_50 + 4);
    if (bVar2) {
      in_stack_ffffffffffffff84 = Literal::fromRep(0x216d5f);
      *(uint32 *)((long)local_50 + 4) = in_stack_ffffffffffffff84.rep_;
      uVar7 = uVar11;
      pp_Var1 = local_50 + 1;
    }
    local_50 = pp_Var1;
    addWatch(in_stack_ffffffffffffff20,
             (Solver *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (uint32)((ulong)in_stack_ffffffffffffff10 >> 0x20),
             (ActiveConstraint)in_stack_ffffffffffffff10);
    addWatch(in_stack_ffffffffffffff20,
             (Solver *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (uint32)((ulong)in_stack_ffffffffffffff10 >> 0x20),
             (ActiveConstraint)in_stack_ffffffffffffff10);
    if (in_RDX != 0) {
      Literal::var(local_58 + 1);
      SharedContext::setFrozen
                ((SharedContext *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 SUB41((uint)in_stack_ffffffffffffff08 >> 0x18,0));
    }
    iVar12 = iVar12 + 1;
    pWVar13 = pWVar13 + 1;
    local_58 = local_58 + 1;
  }
  uVar9 = in_R8->size;
  uVar6 = (uint)((~*(uint *)&in_RDI[2]._vptr_Constraint >> 0x1c & 3) != 0);
  this_00 = (WeightConstraint *)Solver::heuristic((Solver *)0x216e88);
  LVar5.rep_ = (uint32)pWVar13;
  (*(this_00->super_Constraint)._vptr_Constraint[9])
            (this_00,in_RSI,local_58 + ((ulong)uVar6 - (ulong)uVar9),
             (ulong)((in_R8->size - uVar6) + 1),0);
  uVar7 = undoStart((WeightConstraint *)0x216eda);
  *(uint *)&in_RDI[2]._vptr_Constraint =
       *(uint *)&in_RDI[2]._vptr_Constraint & 0xf8000000 | uVar7 & 0x7ffffff;
  *(undefined4 *)((long)&in_RDI[3]._vptr_Constraint + 4) = 0;
  *(undefined4 *)
   ((long)&in_RDI[3]._vptr_Constraint +
   (ulong)(*(uint *)&in_RDI[2]._vptr_Constraint & 0x7ffffff) * 4 + 4) = 0;
  setBpIndex(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  this_01 = in_RSI;
  VVar8 = Literal::var(&local_4);
  VVar4 = Solver::topValue(this_01,in_stack_ffffffffffffff0c);
  if (VVar4 == '\0') {
    addWatch(this_00,(Solver *)CONCAT44(uVar7,VVar8),(uint32)((ulong)this_01 >> 0x20),
             (ActiveConstraint)this_01);
    addWatch(this_00,(Solver *)CONCAT44(uVar7,VVar8),(uint32)((ulong)this_01 >> 0x20),
             (ActiveConstraint)this_01);
  }
  else {
    uVar9 = *(uint *)&in_RDI[2]._vptr_Constraint >> 0x1c & 3;
    lit((WeightConstraint *)
        CONCAT44(CONCAT13(VVar4,(int3)in_stack_ffffffffffffff0c),in_stack_ffffffffffffff08),
        (uint32)((ulong)in_RSI >> 0x20),(ActiveConstraint)in_RSI);
    LVar10 = Literal::operator~((Literal *)
                                CONCAT44(in_stack_fffffffffffffefc,
                                         CONCAT22(in_stack_fffffffffffffefa,
                                                  in_stack_fffffffffffffef8)));
    propagate((WeightConstraint *)CONCAT44(uVar11,iVar12),
              (Solver *)CONCAT44(in_stack_ffffffffffffff84.rep_,uVar6),LVar5,
              (uint32 *)CONCAT44(uVar9,LVar10.rep_));
  }
  return;
}

Assistant:

WeightConstraint::WeightConstraint(Solver& s, SharedContext* ctx, Literal W, const WeightLitsRep& rep, WL* out, uint32 act) {
	typedef unsigned char Byte_t;
	const bool hasW = rep.hasWeights();
	lits_           = out;
	active_         = act;
	ownsLit_        = !out->shareable();
	Literal* p      = lits_->lits;
	Literal* h      = new (reinterpret_cast<Byte_t*>(undo_)) Literal(W);
	weight_t w      = 1;
	bound_[FFB_BTB]	= (rep.reach-rep.bound)+1; // ffb-btb
	bound_[FTB_BFB]	= rep.bound;               // ftb-bfb
	*p++            = ~W;                      // store constraint literal
	if (hasW) *p++  = Literal::fromRep(w);     // and weight if necessary
	if (ctx) ctx->setFrozen(W.var(), true);    // exempt from variable elimination
	if (s.topValue(W.var()) != value_free) {   // only one direction is relevant
		active_ = FFB_BTB+s.isFalse(W);
	}
	watched_        = 3u - (active_ != 3u || ctx == 0);
	WeightLiteral*x = rep.lits;
	for (uint32 sz = rep.size, j = 1; sz--; ++j, ++x) {
		h    = new (h + 1) Literal(x->first);
		*p++ = x->first;                         // store constraint literal
		w    = x->second;                        // followed by weight
		if (hasW) *p++= Literal::fromRep(w);     // if necessary
		addWatch(s, j, FTB_BFB);                 // watches  lits[idx]
		addWatch(s, j, FFB_BTB);                 // watches ~lits[idx]
		if (ctx) ctx->setFrozen(h->var(), true); // exempt from variable elimination
	}
	// init heuristic
	h -= rep.size;
	uint32 off = active_ != NOT_ACTIVE;
	assert((void*)h == (void*)undo_);
	s.heuristic()->newConstraint(s, h+off, rep.size+(1-off), Constraint_t::Static);
	// init undo stack
	up_                 = undoStart();     // undo stack is initially empty
	undo_[0].data       = 0;
	undo_[up_].data     = 0;
	setBpIndex(1);                         // where to start back propagation
	if (s.topValue(W.var()) == value_free){
		addWatch(s, 0, FTB_BFB);             // watch con in both phases
		addWatch(s, 0, FFB_BTB);             // in order to allow for backpropagation
	}
	else {
		uint32 d = active_;                  // propagate con
		WeightConstraint::propagate(s, ~lit(0, (ActiveConstraint)active_), d);
	}
}